

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::CastToInt(VirtualMachine *this)

{
  Variable VVar1;
  allocator<char> local_59;
  string local_58;
  longlong local_28;
  int64_t val;
  Variable top;
  VirtualMachine *this_local;
  
  top.field_1 = (anon_union_8_6_52c89740_for_Variable_1)this;
  VVar1 = popOpStack(this);
  top._0_8_ = VVar1.field_1;
  val._0_4_ = VVar1.type;
  switch((VariableType)val) {
  case Undefined:
    pushUndefined(this);
    break;
  case Integer:
    pushInteger(this,top._0_8_);
    break;
  case Boolean:
    pushUndefined(this);
    break;
  case Float:
    pushInteger(this,(long)(double)top._0_8_);
    break;
  case String:
    local_28 = std::__cxx11::stoll((string *)top._0_8_,(size_t *)0x0,10);
    pushInteger(this,local_28);
    break;
  case Object:
    pushUndefined(this);
    break;
  case Function:
    pushUndefined(this);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Unknown varible type at variableEquals",&local_59);
    panic(this,&local_58);
  }
  advance(this);
  return;
}

Assistant:

void runtime::VirtualMachine::CastToInt() {
  Variable top = this->popOpStack();

  switch (top.type) {
    case VariableType::Integer: {
      this->pushInteger(top.integerValue);
      break;
    }
    case VariableType::Float: {
      this->pushInteger(static_cast<std::int64_t>(top.doubleValue));
      break;
    }
    case VariableType::Function: {
      this->pushUndefined();
      break;
    }
    case VariableType::Object: {
      this->pushUndefined();
      break;
    }
    case VariableType::String: {
      try {
        std::int64_t val = std::stoll(*top.stringValue);
        this->pushInteger(val);

      } catch (...) {
        this->pushUndefined();
      }
      break;
    }
    case VariableType::Undefined: {
      this->pushUndefined();
      break;
    }
    case VariableType::Boolean: {
      this->pushUndefined();
      break;
    }
    default: {
      this->panic("Unknown varible type at variableEquals");
    }
  }

  this->advance();
}